

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

void __thiscall mkvparser::Chapters::Atom::Init(Atom *this)

{
  this->m_string_uid = (char *)0x0;
  this->m_uid = 0;
  *(undefined4 *)&this->m_start_timecode = 0xffffffff;
  *(undefined4 *)((long)&this->m_start_timecode + 4) = 0xffffffff;
  *(undefined4 *)&this->m_stop_timecode = 0xffffffff;
  *(undefined4 *)((long)&this->m_stop_timecode + 4) = 0xffffffff;
  this->m_displays = (Display *)0x0;
  this->m_displays_size = 0;
  this->m_displays_count = 0;
  return;
}

Assistant:

void Chapters::Atom::Init() {
  m_string_uid = NULL;
  m_uid = 0;
  m_start_timecode = -1;
  m_stop_timecode = -1;

  m_displays = NULL;
  m_displays_size = 0;
  m_displays_count = 0;
}